

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O2

void binbuf_restore(_binbuf *x,int argc,t_atom *argv)

{
  char cVar1;
  int iVar2;
  char *__s;
  bool bVar3;
  undefined4 uVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  word wVar8;
  char *pcVar9;
  t_atom *ptVar10;
  bool bVar11;
  int dollar;
  char buf [1000];
  
  iVar2 = x->b_n;
  iVar5 = binbuf_resize(x,argc + iVar2);
  if (iVar5 == 0) {
    pd_error((void *)0x0,"binbuf_restore: out of space");
    return;
  }
  ptVar10 = x->b_vec + iVar2;
  do {
    bVar11 = argc == 0;
    argc = argc + -1;
    if (bVar11) {
      return;
    }
    if (argv->a_type == A_SYMBOL) {
      __s = ((argv->a_w).w_symbol)->s_name;
      cVar1 = *__s;
      if (cVar1 == ',') {
        if (__s[1] != '\0') goto LAB_00162a91;
        ptVar10->a_type = A_COMMA;
      }
      else {
        if ((cVar1 != ';') || (__s[1] != '\0')) {
LAB_00162a91:
          pcVar6 = strchr(__s,0x5c);
          pcVar9 = __s;
          if (pcVar6 == (char *)0x0) {
LAB_00162b1e:
            pcVar6 = strchr(pcVar9,0x24);
            if ((pcVar6 == (char *)0x0) || (9 < (byte)(pcVar6[1] - 0x30U))) {
              ptVar10->a_type = A_SYMBOL;
            }
            else {
LAB_00162b37:
              pcVar6 = pcVar9;
              if (*pcVar9 == '$') {
                do {
                  cVar1 = pcVar6[1];
                  if (cVar1 == '\0') {
                    dollar = 0;
                    __isoc99_sscanf(pcVar9 + 1,"%d",&dollar);
                    ptVar10->a_type = A_DOLLAR;
                    (ptVar10->a_w).w_index = dollar;
                    goto LAB_00162bb3;
                  }
                  pcVar6 = pcVar6 + 1;
                } while (0xf5 < (byte)(cVar1 - 0x3aU));
              }
              ptVar10->a_type = A_DOLLSYM;
              if (pcVar9 != __s) goto LAB_00162b62;
            }
            wVar8 = argv->a_w;
          }
          else {
            lVar7 = 0;
            bVar3 = false;
            bVar11 = false;
            while ((pcVar9 = pcVar9 + 1, cVar1 != '\0' && (lVar7 < 999))) {
              if (bVar11) {
LAB_00162adf:
                buf[lVar7] = cVar1;
                lVar7 = lVar7 + 1;
                bVar11 = false;
              }
              else {
                if (cVar1 != '\\') {
                  if ((cVar1 == '$') && ((byte)(*pcVar9 - 0x30U) < 10)) {
                    bVar3 = true;
                  }
                  goto LAB_00162adf;
                }
                bVar11 = true;
              }
              cVar1 = *pcVar9;
            }
            buf[lVar7] = '\0';
            pcVar9 = buf;
            if (bVar3) goto LAB_00162b37;
            pcVar9 = buf;
            if (pcVar9 == __s) goto LAB_00162b1e;
            ptVar10->a_type = A_SYMBOL;
            pcVar9 = buf;
LAB_00162b62:
            wVar8.w_symbol = gensym(pcVar9);
          }
          (ptVar10->a_w).w_symbol = (t_symbol *)wVar8;
          goto LAB_00162bb3;
        }
        ptVar10->a_type = A_SEMI;
      }
      (ptVar10->a_w).w_float = 0.0;
    }
    else {
      uVar4 = *(undefined4 *)&argv->field_0x4;
      wVar8 = argv->a_w;
      ptVar10->a_type = argv->a_type;
      *(undefined4 *)&ptVar10->field_0x4 = uVar4;
      ptVar10->a_w = wVar8;
    }
LAB_00162bb3:
    argv = argv + 1;
    ptVar10 = ptVar10 + 1;
  } while( true );
}

Assistant:

void binbuf_restore(t_binbuf *x, int argc, const t_atom *argv)
{
    int previoussize = x->b_n;
    int newsize = previoussize + argc, i;
    t_atom *ap;

    if (!binbuf_resize(x, newsize))
    {
        pd_error(0, "binbuf_restore: out of space");
        return;
    }

    for (ap = x->b_vec + previoussize, i = argc; i--; ap++)
    {
        if (argv->a_type == A_SYMBOL)
        {
            const char *str = argv->a_w.w_symbol->s_name, *str2;
            if (!strcmp(str, ";")) SETSEMI(ap);
            else if (!strcmp(str, ",")) SETCOMMA(ap);
            else
            {
                char buf[MAXPDSTRING], *sp1;
                const char *sp2, *usestr;
                int dollar = 0;
                if (strchr(str, '\\'))
                {
                    int slashed = 0;
                    for (sp1 = buf, sp2 = argv->a_w.w_symbol->s_name;
                        *sp2 && sp1 < buf + (MAXPDSTRING-1);
                            sp2++)
                    {
                        if (slashed)
                            *sp1++ = *sp2, slashed = 0;
                        else if (*sp2 == '\\')
                            slashed = 1;
                        else
                        {
                            if (*sp2 == '$' && sp2[1] >= '0' && sp2[1] <= '9')
                                dollar = 1;
                            *sp1++ = *sp2;
                            slashed = 0;
                        }
                    }
                    *sp1 = 0;
                    usestr = buf;
                }
                else usestr = str;
                if (dollar || (usestr== str && (str2 = strchr(usestr, '$')) &&
                    str2[1] >= '0' && str2[1] <= '9'))
                {
                    int dollsym = 0;
                    if (*usestr != '$')
                        dollsym = 1;
                    else for (str2 = usestr + 1; *str2; str2++)
                        if (*str2 < '0' || *str2 > '9')
                    {
                        dollsym = 1;
                        break;
                    }
                    if (dollsym)
                        SETDOLLSYM(ap, usestr == str ?
                            argv->a_w.w_symbol : gensym(usestr));
                    else
                    {
                        int dollar = 0;
                        sscanf(usestr + 1, "%d", &dollar);
                        SETDOLLAR(ap, dollar);
                    }
                }
                else SETSYMBOL(ap, usestr == str ?
                    argv->a_w.w_symbol : gensym(usestr));
                /* fprintf(stderr, "arg %s -> binbuf %s type %d\n",
                    argv->a_w.w_symbol->s_name, usestr, ap->a_type); */
            }
            argv++;
        }
        else *ap = *(argv++);
    }
}